

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerSharedLock(Pager *pPager)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  char cStack_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char dbFileVers [16];
  uint local_28;
  int f;
  int fout;
  int bExists;
  sqlite3_vfs *pVfs;
  int bHotJournal;
  int rc;
  Pager *pPager_local;
  
  pVfs._4_4_ = 0;
  _bHotJournal = pPager;
  if ((pPager->pWal == (Wal *)0x0) && (pPager->eState == '\0')) {
    pVfs._0_4_ = 1;
    pVfs._4_4_ = pager_wait_on_lock(pPager,1);
    if (pVfs._4_4_ != 0) goto LAB_00169f35;
    if (_bHotJournal->eLock < 2) {
      pVfs._4_4_ = hasHotJournal(_bHotJournal,(int *)&pVfs);
    }
    if (pVfs._4_4_ != 0) goto LAB_00169f35;
    if ((int)pVfs != 0) {
      if (_bHotJournal->readOnly != '\0') {
        pVfs._4_4_ = 0x308;
        goto LAB_00169f35;
      }
      pVfs._4_4_ = pagerLockDb(_bHotJournal,4);
      if (pVfs._4_4_ != 0) goto LAB_00169f35;
      if (_bHotJournal->jfd->pMethods == (sqlite3_io_methods *)0x0) {
        _fout = _bHotJournal->pVfs;
        pVfs._4_4_ = sqlite3OsAccess(_fout,_bHotJournal->zJournal,0,&f);
        if ((pVfs._4_4_ == 0) && (f != 0)) {
          local_28 = 0;
          pVfs._4_4_ = sqlite3OsOpen(_fout,_bHotJournal->zJournal,_bHotJournal->jfd,0x802,
                                     (int *)&local_28);
          if ((pVfs._4_4_ == 0) && ((local_28 & 1) != 0)) {
            pVfs._4_4_ = sqlite3CantopenError(0xda25);
            sqlite3OsClose(_bHotJournal->jfd);
          }
        }
      }
      if (_bHotJournal->jfd->pMethods == (sqlite3_io_methods *)0x0) {
        if (_bHotJournal->exclusiveMode == '\0') {
          pagerUnlockDb(_bHotJournal,1);
        }
      }
      else {
        pVfs._4_4_ = pagerSyncHotJournal(_bHotJournal);
        if (pVfs._4_4_ == 0) {
          pVfs._4_4_ = pager_playback(_bHotJournal,
                                      (uint)((_bHotJournal->tempFile != '\0' ^ 0xffU) & 1));
          _bHotJournal->eState = '\0';
        }
      }
      if (pVfs._4_4_ != 0) {
        pager_error(_bHotJournal,pVfs._4_4_);
        goto LAB_00169f35;
      }
    }
    if ((_bHotJournal->tempFile == '\0') && (_bHotJournal->hasHeldSharedLock != '\0')) {
      pVfs._4_4_ = sqlite3OsRead(_bHotJournal->fd,&cStack_48,0x10,0x18);
      if (pVfs._4_4_ != 0) {
        if (pVfs._4_4_ != 0x20a) goto LAB_00169f35;
        memset(&cStack_48,0,0x10);
      }
      cVar7 = -(_bHotJournal->dbFileVers[0] == cStack_48);
      cVar8 = -(_bHotJournal->dbFileVers[1] == cStack_47);
      cVar9 = -(_bHotJournal->dbFileVers[2] == cStack_46);
      cVar10 = -(_bHotJournal->dbFileVers[3] == cStack_45);
      cVar11 = -(_bHotJournal->dbFileVers[4] == cStack_44);
      cVar12 = -(_bHotJournal->dbFileVers[5] == cStack_43);
      cVar13 = -(_bHotJournal->dbFileVers[6] == cStack_42);
      cVar14 = -(_bHotJournal->dbFileVers[7] == cStack_41);
      cVar15 = -(_bHotJournal->dbFileVers[8] == dbFileVers[0]);
      cVar16 = -(_bHotJournal->dbFileVers[9] == dbFileVers[1]);
      cVar17 = -(_bHotJournal->dbFileVers[10] == dbFileVers[2]);
      cVar18 = -(_bHotJournal->dbFileVers[0xb] == dbFileVers[3]);
      cVar19 = -(_bHotJournal->dbFileVers[0xc] == dbFileVers[4]);
      cVar20 = -(_bHotJournal->dbFileVers[0xd] == dbFileVers[5]);
      cVar21 = -(_bHotJournal->dbFileVers[0xe] == dbFileVers[6]);
      bVar22 = -(_bHotJournal->dbFileVers[0xf] == dbFileVers[7]);
      auVar1[1] = cVar8;
      auVar1[0] = cVar7;
      auVar1[2] = cVar9;
      auVar1[3] = cVar10;
      auVar1[4] = cVar11;
      auVar1[5] = cVar12;
      auVar1[6] = cVar13;
      auVar1[7] = cVar14;
      auVar1[8] = cVar15;
      auVar1[9] = cVar16;
      auVar1[10] = cVar17;
      auVar1[0xb] = cVar18;
      auVar1[0xc] = cVar19;
      auVar1[0xd] = cVar20;
      auVar1[0xe] = cVar21;
      auVar1[0xf] = bVar22;
      auVar2[1] = cVar8;
      auVar2[0] = cVar7;
      auVar2[2] = cVar9;
      auVar2[3] = cVar10;
      auVar2[4] = cVar11;
      auVar2[5] = cVar12;
      auVar2[6] = cVar13;
      auVar2[7] = cVar14;
      auVar2[8] = cVar15;
      auVar2[9] = cVar16;
      auVar2[10] = cVar17;
      auVar2[0xb] = cVar18;
      auVar2[0xc] = cVar19;
      auVar2[0xd] = cVar20;
      auVar2[0xe] = cVar21;
      auVar2[0xf] = bVar22;
      auVar6[1] = cVar10;
      auVar6[0] = cVar9;
      auVar6[2] = cVar11;
      auVar6[3] = cVar12;
      auVar6[4] = cVar13;
      auVar6[5] = cVar14;
      auVar6[6] = cVar15;
      auVar6[7] = cVar16;
      auVar6[8] = cVar17;
      auVar6[9] = cVar18;
      auVar6[10] = cVar19;
      auVar6[0xb] = cVar20;
      auVar6[0xc] = cVar21;
      auVar6[0xd] = bVar22;
      auVar5[1] = cVar11;
      auVar5[0] = cVar10;
      auVar5[2] = cVar12;
      auVar5[3] = cVar13;
      auVar5[4] = cVar14;
      auVar5[5] = cVar15;
      auVar5[6] = cVar16;
      auVar5[7] = cVar17;
      auVar5[8] = cVar18;
      auVar5[9] = cVar19;
      auVar5[10] = cVar20;
      auVar5[0xb] = cVar21;
      auVar5[0xc] = bVar22;
      auVar4[1] = cVar12;
      auVar4[0] = cVar11;
      auVar4[2] = cVar13;
      auVar4[3] = cVar14;
      auVar4[4] = cVar15;
      auVar4[5] = cVar16;
      auVar4[6] = cVar17;
      auVar4[7] = cVar18;
      auVar4[8] = cVar19;
      auVar4[9] = cVar20;
      auVar4[10] = cVar21;
      auVar4[0xb] = bVar22;
      auVar3[1] = cVar13;
      auVar3[0] = cVar12;
      auVar3[2] = cVar14;
      auVar3[3] = cVar15;
      auVar3[4] = cVar16;
      auVar3[5] = cVar17;
      auVar3[6] = cVar18;
      auVar3[7] = cVar19;
      auVar3[8] = cVar20;
      auVar3[9] = cVar21;
      auVar3[10] = bVar22;
      if (((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                    (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                    (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                    (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                    (ushort)((byte)(CONCAT19(bVar22,CONCAT18(cVar21,CONCAT17(cVar20,CONCAT16(cVar19,
                                                  CONCAT15(cVar18,CONCAT14(cVar17,CONCAT13(cVar16,
                                                  CONCAT12(cVar15,CONCAT11(cVar14,cVar13))))))))) >>
                                   7) & 1) << 6 |
                    (ushort)((byte)(CONCAT18(bVar22,CONCAT17(cVar21,CONCAT16(cVar20,CONCAT15(cVar19,
                                                  CONCAT14(cVar18,CONCAT13(cVar17,CONCAT12(cVar16,
                                                  CONCAT11(cVar15,cVar14)))))))) >> 7) & 1) << 7 |
                   (ushort)(bVar22 >> 7) << 0xf) != 0xffff) &&
         (pager_reset(_bHotJournal), _bHotJournal->bUseFetch != '\0')) {
        sqlite3OsUnfetch(_bHotJournal->fd,0,(void *)0x0);
      }
    }
    pVfs._4_4_ = pagerOpenWalIfPresent(_bHotJournal);
  }
  if (_bHotJournal->pWal != (Wal *)0x0) {
    pVfs._4_4_ = pagerBeginReadTransaction(_bHotJournal);
  }
  if (((_bHotJournal->tempFile == '\0') && (_bHotJournal->eState == '\0')) && (pVfs._4_4_ == 0)) {
    pVfs._4_4_ = pagerPagecount(_bHotJournal,&_bHotJournal->dbSize);
  }
LAB_00169f35:
  if (pVfs._4_4_ == 0) {
    _bHotJournal->eState = '\x01';
    _bHotJournal->hasHeldSharedLock = '\x01';
  }
  else {
    pager_unlock(_bHotJournal);
  }
  return pVfs._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSharedLock(Pager *pPager){
  int rc = SQLITE_OK;                /* Return code */

  /* This routine is only called from b-tree and only when there are no
  ** outstanding pages. This implies that the pager state should either
  ** be OPEN or READER. READER is only possible if the pager is or was in 
  ** exclusive access mode.  */
  assert( sqlite3PcacheRefCount(pPager->pPCache)==0 );
  assert( assert_pager_state(pPager) );
  assert( pPager->eState==PAGER_OPEN || pPager->eState==PAGER_READER );
  assert( pPager->errCode==SQLITE_OK );

  if( !pagerUseWal(pPager) && pPager->eState==PAGER_OPEN ){
    int bHotJournal = 1;          /* True if there exists a hot journal-file */

    assert( !MEMDB );
    assert( pPager->tempFile==0 || pPager->eLock==EXCLUSIVE_LOCK );

    rc = pager_wait_on_lock(pPager, SHARED_LOCK);
    if( rc!=SQLITE_OK ){
      assert( pPager->eLock==NO_LOCK || pPager->eLock==UNKNOWN_LOCK );
      goto failed;
    }

    /* If a journal file exists, and there is no RESERVED lock on the
    ** database file, then it either needs to be played back or deleted.
    */
    if( pPager->eLock<=SHARED_LOCK ){
      rc = hasHotJournal(pPager, &bHotJournal);
    }
    if( rc!=SQLITE_OK ){
      goto failed;
    }
    if( bHotJournal ){
      if( pPager->readOnly ){
        rc = SQLITE_READONLY_ROLLBACK;
        goto failed;
      }

      /* Get an EXCLUSIVE lock on the database file. At this point it is
      ** important that a RESERVED lock is not obtained on the way to the
      ** EXCLUSIVE lock. If it were, another process might open the
      ** database file, detect the RESERVED lock, and conclude that the
      ** database is safe to read while this process is still rolling the 
      ** hot-journal back.
      ** 
      ** Because the intermediate RESERVED lock is not requested, any
      ** other process attempting to access the database file will get to 
      ** this point in the code and fail to obtain its own EXCLUSIVE lock 
      ** on the database file.
      **
      ** Unless the pager is in locking_mode=exclusive mode, the lock is
      ** downgraded to SHARED_LOCK before this function returns.
      */
      rc = pagerLockDb(pPager, EXCLUSIVE_LOCK);
      if( rc!=SQLITE_OK ){
        goto failed;
      }
 
      /* If it is not already open and the file exists on disk, open the 
      ** journal for read/write access. Write access is required because 
      ** in exclusive-access mode the file descriptor will be kept open 
      ** and possibly used for a transaction later on. Also, write-access 
      ** is usually required to finalize the journal in journal_mode=persist 
      ** mode (and also for journal_mode=truncate on some systems).
      **
      ** If the journal does not exist, it usually means that some 
      ** other connection managed to get in and roll it back before 
      ** this connection obtained the exclusive lock above. Or, it 
      ** may mean that the pager was in the error-state when this
      ** function was called and the journal file does not exist.
      */
      if( !isOpen(pPager->jfd) ){
        sqlite3_vfs * const pVfs = pPager->pVfs;
        int bExists;              /* True if journal file exists */
        rc = sqlite3OsAccess(
            pVfs, pPager->zJournal, SQLITE_ACCESS_EXISTS, &bExists);
        if( rc==SQLITE_OK && bExists ){
          int fout = 0;
          int f = SQLITE_OPEN_READWRITE|SQLITE_OPEN_MAIN_JOURNAL;
          assert( !pPager->tempFile );
          rc = sqlite3OsOpen(pVfs, pPager->zJournal, pPager->jfd, f, &fout);
          assert( rc!=SQLITE_OK || isOpen(pPager->jfd) );
          if( rc==SQLITE_OK && fout&SQLITE_OPEN_READONLY ){
            rc = SQLITE_CANTOPEN_BKPT;
            sqlite3OsClose(pPager->jfd);
          }
        }
      }
 
      /* Playback and delete the journal.  Drop the database write
      ** lock and reacquire the read lock. Purge the cache before
      ** playing back the hot-journal so that we don't end up with
      ** an inconsistent cache.  Sync the hot journal before playing
      ** it back since the process that crashed and left the hot journal
      ** probably did not sync it and we are required to always sync
      ** the journal before playing it back.
      */
      if( isOpen(pPager->jfd) ){
        assert( rc==SQLITE_OK );
        rc = pagerSyncHotJournal(pPager);
        if( rc==SQLITE_OK ){
          rc = pager_playback(pPager, !pPager->tempFile);
          pPager->eState = PAGER_OPEN;
        }
      }else if( !pPager->exclusiveMode ){
        pagerUnlockDb(pPager, SHARED_LOCK);
      }

      if( rc!=SQLITE_OK ){
        /* This branch is taken if an error occurs while trying to open
        ** or roll back a hot-journal while holding an EXCLUSIVE lock. The
        ** pager_unlock() routine will be called before returning to unlock
        ** the file. If the unlock attempt fails, then Pager.eLock must be
        ** set to UNKNOWN_LOCK (see the comment above the #define for 
        ** UNKNOWN_LOCK above for an explanation). 
        **
        ** In order to get pager_unlock() to do this, set Pager.eState to
        ** PAGER_ERROR now. This is not actually counted as a transition
        ** to ERROR state in the state diagram at the top of this file,
        ** since we know that the same call to pager_unlock() will very
        ** shortly transition the pager object to the OPEN state. Calling
        ** assert_pager_state() would fail now, as it should not be possible
        ** to be in ERROR state when there are zero outstanding page 
        ** references.
        */
        pager_error(pPager, rc);
        goto failed;
      }

      assert( pPager->eState==PAGER_OPEN );
      assert( (pPager->eLock==SHARED_LOCK)
           || (pPager->exclusiveMode && pPager->eLock>SHARED_LOCK)
      );
    }

    if( !pPager->tempFile && pPager->hasHeldSharedLock ){
      /* The shared-lock has just been acquired then check to
      ** see if the database has been modified.  If the database has changed,
      ** flush the cache.  The hasHeldSharedLock flag prevents this from
      ** occurring on the very first access to a file, in order to save a
      ** single unnecessary sqlite3OsRead() call at the start-up.
      **
      ** Database changes are detected by looking at 15 bytes beginning
      ** at offset 24 into the file.  The first 4 of these 16 bytes are
      ** a 32-bit counter that is incremented with each change.  The
      ** other bytes change randomly with each file change when
      ** a codec is in use.
      ** 
      ** There is a vanishingly small chance that a change will not be 
      ** detected.  The chance of an undetected change is so small that
      ** it can be neglected.
      */
      char dbFileVers[sizeof(pPager->dbFileVers)];

      IOTRACE(("CKVERS %p %d\n", pPager, sizeof(dbFileVers)));
      rc = sqlite3OsRead(pPager->fd, &dbFileVers, sizeof(dbFileVers), 24);
      if( rc!=SQLITE_OK ){
        if( rc!=SQLITE_IOERR_SHORT_READ ){
          goto failed;
        }
        memset(dbFileVers, 0, sizeof(dbFileVers));
      }

      if( memcmp(pPager->dbFileVers, dbFileVers, sizeof(dbFileVers))!=0 ){
        pager_reset(pPager);

        /* Unmap the database file. It is possible that external processes
        ** may have truncated the database file and then extended it back
        ** to its original size while this process was not holding a lock.
        ** In this case there may exist a Pager.pMap mapping that appears
        ** to be the right size but is not actually valid. Avoid this
        ** possibility by unmapping the db here. */
        if( USEFETCH(pPager) ){
          sqlite3OsUnfetch(pPager->fd, 0, 0);
        }
      }
    }

    /* If there is a WAL file in the file-system, open this database in WAL
    ** mode. Otherwise, the following function call is a no-op.
    */
    rc = pagerOpenWalIfPresent(pPager);
#ifndef SQLITE_OMIT_WAL
    assert( pPager->pWal==0 || rc==SQLITE_OK );
#endif
  }

  if( pagerUseWal(pPager) ){
    assert( rc==SQLITE_OK );
    rc = pagerBeginReadTransaction(pPager);
  }

  if( pPager->tempFile==0 && pPager->eState==PAGER_OPEN && rc==SQLITE_OK ){
    rc = pagerPagecount(pPager, &pPager->dbSize);
  }

 failed:
  if( rc!=SQLITE_OK ){
    assert( !MEMDB );
    pager_unlock(pPager);
    assert( pPager->eState==PAGER_OPEN );
  }else{
    pPager->eState = PAGER_READER;
    pPager->hasHeldSharedLock = 1;
  }
  return rc;
}